

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall TArray<vertex_t_*,_vertex_t_*>::ShrinkToFit(TArray<vertex_t_*,_vertex_t_*> *this)

{
  uint uVar1;
  vertex_t **ppvVar2;
  
  uVar1 = this->Count;
  if (uVar1 < this->Most) {
    this->Most = uVar1;
    if (uVar1 == 0) {
      if (this->Array == (vertex_t **)0x0) {
        return;
      }
      M_Free(this->Array);
      ppvVar2 = (vertex_t **)0x0;
    }
    else {
      ppvVar2 = (vertex_t **)
                M_Realloc_Dbg(this->Array,(ulong)uVar1 << 3,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/tarray.h"
                              ,0x1a8);
    }
    this->Array = ppvVar2;
  }
  return;
}

Assistant:

void ShrinkToFit ()
	{
		if (Most > Count)
		{
			Most = Count;
			if (Most == 0)
			{
				if (Array != NULL)
				{
					M_Free (Array);
					Array = NULL;
				}
			}
			else
			{
				DoResize ();
			}
		}
	}